

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BeginGroup(void)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiGroupData *pIVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  ImGuiGroupData *__dest;
  int iVar7;
  int iVar8;
  ImGuiContext *g;
  float fVar9;
  
  pIVar6 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  iVar2 = (pIVar3->DC).GroupStack.Size;
  iVar8 = iVar2 + 1;
  iVar7 = (pIVar3->DC).GroupStack.Capacity;
  if (iVar2 < iVar7) {
    __dest = (pIVar3->DC).GroupStack.Data;
  }
  else {
    if (iVar7 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar7 / 2 + iVar7;
    }
    if (iVar7 <= iVar8) {
      iVar7 = iVar8;
    }
    piVar1 = &(pIVar6->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (ImGuiGroupData *)(*GImAllocatorAllocFunc)((long)iVar7 * 0x30,GImAllocatorUserData);
    pIVar4 = (pIVar3->DC).GroupStack.Data;
    if (pIVar4 != (ImGuiGroupData *)0x0) {
      memcpy(__dest,pIVar4,(long)(pIVar3->DC).GroupStack.Size * 0x30);
      pIVar4 = (pIVar3->DC).GroupStack.Data;
      if ((pIVar4 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
    }
    (pIVar3->DC).GroupStack.Data = __dest;
    (pIVar3->DC).GroupStack.Capacity = iVar7;
  }
  (pIVar3->DC).GroupStack.Size = iVar8;
  __dest[iVar2].BackupCursorPos = (pIVar3->DC).CursorPos;
  __dest[iVar2].BackupCursorMaxPos = (pIVar3->DC).CursorMaxPos;
  __dest[iVar2].BackupIndent.x = (pIVar3->DC).Indent.x;
  __dest[iVar2].BackupGroupOffset.x = (pIVar3->DC).GroupOffset.x;
  __dest[iVar2].BackupCurrentLineSize = (pIVar3->DC).CurrentLineSize;
  __dest[iVar2].BackupCurrentLineTextBaseOffset = (pIVar3->DC).CurrentLineTextBaseOffset;
  __dest[iVar2].BackupLogLinePosY = (pIVar3->DC).LogLinePosY;
  __dest[iVar2].BackupActiveIdIsAlive = pIVar6->ActiveIdIsAlive;
  __dest[iVar2].BackupActiveIdPreviousFrameIsAlive = pIVar6->ActiveIdPreviousFrameIsAlive;
  __dest[iVar2].AdvanceCursor = true;
  fVar9 = ((pIVar3->DC).CursorPos.x - (pIVar3->Pos).x) - (pIVar3->DC).ColumnsOffset.x;
  (pIVar3->DC).GroupOffset.x = fVar9;
  (pIVar3->DC).Indent.x = fVar9;
  IVar5 = (pIVar3->DC).CursorPos;
  (pIVar3->DC).CursorMaxPos = IVar5;
  (pIVar3->DC).CurrentLineSize.x = 0.0;
  (pIVar3->DC).CurrentLineSize.y = 0.0;
  (pIVar3->DC).LogLinePosY = IVar5.y + -9999.0;
  return;
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    window->DC.GroupStack.resize(window->DC.GroupStack.Size + 1);
    ImGuiGroupData& group_data = window->DC.GroupStack.back();
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrentLineSize = window->DC.CurrentLineSize;
    group_data.BackupCurrentLineTextBaseOffset = window->DC.CurrentLineTextBaseOffset;
    group_data.BackupLogLinePosY = window->DC.LogLinePosY;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.AdvanceCursor = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrentLineSize = ImVec2(0.0f, 0.0f);
    window->DC.LogLinePosY = window->DC.CursorPos.y - 9999.0f; // To enforce Log carriage return
}